

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.h
# Opt level: O2

void __thiscall mnf::RealSpace::~RealSpace(RealSpace *this)

{
  ~RealSpace(this);
  operator_delete(this);
  return;
}

Assistant:

class MANIFOLDS_API RealSpace : public Manifold
{
 public:
  /// \brief Constructor
  /// \param n the dimension of the realspace \f$\mathbb{R}^n\f$
  RealSpace(Index n);
  RealSpace(Index n, double magnitude);
  RealSpace(Index n, const ConstRefVec& magnitude);

  virtual size_t numberOfSubManifolds() const;
  virtual const Manifold& operator()(size_t i) const;

  virtual std::string toString(
      const ConstRefVec& val, const std::string& prefix = "",
      const Eigen::IOFormat& fmt = mnf::defaultFormat) const;
  virtual void getTypicalMagnitude_(RefVec out) const;
  void setTypicalMagnitude(double magnitude);
  void setTypicalMagnitude(const ConstRefVec& out);
  virtual void getTrustMagnitude_(RefVec out) const;
  void setTrustMagnitude(const double& magnitude);
  void setTrustMagnitude(const ConstRefVec& out);
  virtual bool isElementary() const;
  virtual bool isSameTopology(const Manifold& other) const;
  virtual long getTypeId() const;

 protected:
  // map operations
  virtual bool isInM_(const Eigen::VectorXd&, double prec) const;
  virtual void forceOnM_(RefVec out, const ConstRefVec& in) const;
  virtual void getIdentityOnTxM_(RefMat out, const ConstRefVec& x) const;
  virtual void createRandomPoint_(RefVec out, double coeff) const;
  virtual void retractation_(RefVec out, const ConstRefVec& x,
                             const ConstRefVec& v) const;
  virtual void pseudoLog_(RefVec out, const ConstRefVec& x,
                          const ConstRefVec& y) const;
  virtual void pseudoLog0_(RefVec out, const ConstRefVec& x) const;
  virtual void setZero_(RefVec out) const;
  virtual Eigen::MatrixXd diffRetractation_(const ConstRefVec& x) const;
  virtual void applyDiffRetractation_(RefMat out, const ConstRefMat& in,
                                      const ConstRefVec& x) const;
  virtual Eigen::MatrixXd diffPseudoLog0_(const ConstRefVec& x) const;
  virtual void applyDiffPseudoLog0_(RefMat out, const ConstRefMat& in,
                                    const ConstRefVec& x) const;
  virtual void applyTransport_(RefMat out, const ConstRefMat& in,
                               const ConstRefVec& x,
                               const ConstRefVec& v) const;
  virtual void applyInvTransport_(RefMat out, const ConstRefMat& in,
                                  const ConstRefVec& x,
                                  const ConstRefVec& v) const;
  virtual void applyInvTransportOnTheRight_(RefMat out, const ConstRefMat& in,
                                            const ConstRefVec& x,
                                            const ConstRefVec& v) const;

  virtual void tangentConstraint_(RefMat out, const ConstRefVec& x) const;
  virtual bool isInTxM_(const ConstRefVec& x, const ConstRefVec& v,
                        const double& prec) const;
  virtual void forceOnTxM_(RefVec out, const ConstRefVec& in,
                           const ConstRefVec& x) const;
  virtual void limitMap_(RefVec out) const;

  virtual std::shared_ptr<Manifold> getNewCopy_() const;

 private:
  Eigen::VectorXd typicalMagnitude_;
  Eigen::VectorXd trustMagnitude_;
}